

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::SlotI2
          (ByteCodeWriter *this,OpCode op,RegSlot value,uint32 slotId1,uint32 slotId2)

{
  code *pcVar1;
  bool bVar2;
  RegSlot value_00;
  undefined4 *puVar3;
  
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x3f);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x6c4,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007ce17b;
    *puVar3 = 0;
  }
  value_00 = ConsumeReg(this,value);
  if (((0x11 < op - 0x140) || ((0x3a119U >> (op - 0x140 & 0x1f) & 1) == 0)) && (1 < op - 0x94)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x6db,"(false)",
                                "The specified OpCode is not intended for slot access");
    if (!bVar2) goto LAB_007ce17b;
    *puVar3 = 0;
  }
  bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,op,value_00,slotId1,slotId2);
  if (!bVar2) {
    bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,op,value_00,slotId1,slotId2);
    if (!bVar2) {
      bVar2 = TryWriteElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,op,value_00,slotId1,slotId2);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x6e1,"(success)","success");
        if (!bVar2) {
LAB_007ce17b:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::SlotI2(OpCode op, RegSlot value, uint32 slotId1, uint32 slotId2)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementSlotI2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);

#if DBG
        switch (op)
        {
            case OpCode::StInnerSlot:
            case OpCode::StInnerSlotChkUndecl:
            case OpCode::StInnerObjSlot:
            case OpCode::StInnerObjSlotChkUndecl:
            case OpCode::StEnvSlot:
            case OpCode::StEnvSlotChkUndecl:
            case OpCode::StEnvObjSlot:
            case OpCode::StEnvObjSlotChkUndecl:
            case OpCode::StModuleSlot:
            case OpCode::LdModuleSlot:
            {
                break;
            }

            default:
            {
                AssertMsg(false, "The specified OpCode is not intended for slot access");
                break;
            }
        }
#endif

        MULTISIZE_LAYOUT_WRITE(ElementSlotI2, op, value, slotId1, slotId2);
    }